

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscPrintReceivedElements.cpp
# Opt level: O0

ostream * osc::operator<<(ostream *os,ReceivedMessage *m)

{
  bool bVar1;
  uint32 uVar2;
  char *pcVar3;
  ReceivedMessageArgument *arg;
  ReceivedMessageArgument local_40;
  undefined1 local_30 [8];
  const_iterator i;
  bool first;
  ReceivedMessage *m_local;
  ostream *os_local;
  
  std::operator<<(os,"[");
  bVar1 = ReceivedMessage::AddressPatternIsUInt32(m);
  if (bVar1) {
    uVar2 = ReceivedMessage::AddressPatternAsUInt32(m);
    std::ostream::operator<<(os,uVar2);
  }
  else {
    pcVar3 = ReceivedMessage::AddressPattern(m);
    std::operator<<(os,pcVar3);
  }
  i.value_.argumentPtr_._7_1_ = 1;
  _local_30 = (ReceivedMessageArgument)ReceivedMessage::ArgumentsBegin(m);
  while( true ) {
    local_40 = (ReceivedMessageArgument)ReceivedMessage::ArgumentsEnd(m);
    bVar1 = operator!=((ReceivedMessageArgumentIterator *)local_30,
                       (ReceivedMessageArgumentIterator *)&local_40);
    if (!bVar1) break;
    if ((i.value_.argumentPtr_._7_1_ & 1) == 0) {
      std::operator<<(os,", ");
    }
    else {
      std::operator<<(os," ");
      i.value_.argumentPtr_._7_1_ = 0;
    }
    arg = ReceivedMessageArgumentIterator::operator*((ReceivedMessageArgumentIterator *)local_30);
    operator<<(os,arg);
    ReceivedMessageArgumentIterator::operator++((ReceivedMessageArgumentIterator *)local_30);
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream& operator<<( std::ostream & os, const ReceivedMessage& m )
{
    os << "[";
    if( m.AddressPatternIsUInt32() )
        os << m.AddressPatternAsUInt32();
    else
        os << m.AddressPattern();
    
    bool first = true;
    for( ReceivedMessage::const_iterator i = m.ArgumentsBegin();
            i != m.ArgumentsEnd(); ++i ){
        if( first ){
            os << " ";
            first = false;
        }else{
            os << ", ";
        }

        os << *i;
    }

    os << "]";

    return os;
}